

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O1

Real __thiscall amrex::FluxRegister::SumReg(FluxRegister *this,int comp)

{
  FabArray<amrex::FArrayBox> *this_00;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  FabSetIter fsi;
  double local_138;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  local_138 = 0.0;
  lVar2 = 0;
  do {
    this_00 = (FabArray<amrex::FArrayBox> *)((this->super_BndryRegister).bndry + lVar2);
    MFIter::MFIter(&local_90,(FabArrayBase *)this_00,'\0');
    if (local_90.currentIndex < local_90.endIndex) {
      do {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_d0,this_00,&local_90);
        lVar1 = (long)local_d0.begin.z;
        if (local_d0.begin.z < local_d0.end.z) {
          pdVar6 = local_d0.p + local_d0.nstride * comp;
          do {
            lVar4 = (long)local_d0.begin.y;
            pdVar5 = pdVar6;
            if (local_d0.begin.y < local_d0.end.y) {
              do {
                if (local_d0.begin.x < local_d0.end.x) {
                  lVar3 = 0;
                  do {
                    local_138 = local_138 + pdVar5[lVar3];
                    lVar3 = lVar3 + 1;
                  } while ((long)local_d0.end.x - (long)local_d0.begin.x != lVar3);
                }
                lVar4 = lVar4 + 1;
                pdVar5 = pdVar5 + local_d0.jstride;
              } while (lVar4 != local_d0.end.y);
            }
            lVar1 = lVar1 + 1;
            pdVar6 = pdVar6 + local_d0.kstride;
          } while (lVar1 != local_d0.end.z);
        }
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_110,
                   (FabArray<amrex::FArrayBox> *)((this->super_BndryRegister).bndry + lVar2 + 3),
                   &local_90);
        lVar1 = (long)local_110.begin.z;
        if (local_110.begin.z < local_110.end.z) {
          pdVar6 = local_110.p + local_110.nstride * comp;
          do {
            lVar4 = (long)local_110.begin.y;
            pdVar5 = pdVar6;
            if (local_110.begin.y < local_110.end.y) {
              do {
                if (local_110.begin.x < local_110.end.x) {
                  lVar3 = 0;
                  do {
                    local_138 = local_138 - pdVar5[lVar3];
                    lVar3 = lVar3 + 1;
                  } while ((long)local_110.end.x - (long)local_110.begin.x != lVar3);
                }
                lVar4 = lVar4 + 1;
                pdVar5 = pdVar5 + local_110.jstride;
              } while (lVar4 != local_110.end.y);
            }
            lVar1 = lVar1 + 1;
            pdVar6 = pdVar6 + local_110.kstride;
          } while (lVar1 != local_110.end.z);
        }
        MFIter::operator++(&local_90);
      } while (local_90.currentIndex < local_90.endIndex);
    }
    MFIter::~MFIter(&local_90);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return local_138;
}

Assistant:

Real
FluxRegister::SumReg (int comp) const
{
    Real sum = 0.0;

    for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
    {
        const FabSet& lofabs = bndry[Orientation(dir,Orientation::low) ];
        const FabSet& hifabs = bndry[Orientation(dir,Orientation::high)];

#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion())
        {
            sum += amrex::ReduceSum(lofabs.m_mf, 0,
                   [=] AMREX_GPU_HOST_DEVICE (Box const& tbx,
                                              Array4<Real const> const& lofab) -> Real
                   {
                       Real r = 0.0;
                       AMREX_LOOP_3D(tbx, i, j, k,
                       {
                           r += lofab(i,j,k,comp);
                       });
                       return r;
                   });
            sum += amrex::ReduceSum(hifabs.m_mf, 0,
                   [=] AMREX_GPU_HOST_DEVICE (Box const& tbx,
                                              Array4<Real const> const& hifab) -> Real
                   {
                       Real r = 0.0;
                       AMREX_LOOP_3D(tbx, i, j, k,
                       {
                           r -= hifab(i,j,k,comp);
                       });
                       return r;
                   });
        }
        else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(+:sum)
#endif
            for (FabSetIter fsi(lofabs); fsi.isValid(); ++fsi)
            {
                Array4<Real const> const& lofab = lofabs.const_array(fsi);
                Box lobx(lofab);
                AMREX_LOOP_3D(lobx, i, j, k,
                {
                    sum += lofab(i,j,k,comp);
                });
                Array4<Real const> const& hifab = hifabs.const_array(fsi);
                Box hibx(hifab);
                AMREX_LOOP_3D(hibx, i, j, k,
                {
                    sum -= hifab(i,j,k,comp);
                });
            }
        }
    }

    ParallelDescriptor::ReduceRealSum(sum);

    return sum;
}